

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O1

void __thiscall
StunMsgEncode_RFC5769SampleIPv6Response_Test::TestBody
          (StunMsgEncode_RFC5769SampleIPv6Response_Test *this)

{
  long *plVar1;
  pointer msg_hdr;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  size_t sVar5;
  stun_attr_hdr *psVar6;
  stun_attr_xor_sockaddr *attr;
  ulong uVar7;
  stun_attr_msgint *msgint;
  stun_attr_uint32 *fingerprint;
  ulong uVar8;
  uint uVar9;
  char *message_00;
  pointer pcVar10;
  char *in_R9;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar;
  sockaddr_in6 test_addr;
  message message;
  char software_name [12];
  char password [23];
  sockaddr_in6 ipv6;
  uint8_t tsx_id [12];
  AssertHelper local_108;
  msgint local_100;
  undefined1 local_f0 [32];
  AssertHelper local_d0;
  undefined1 local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  uint uStack_b8;
  uint uStack_b4;
  undefined4 uStack_b0;
  base_message<std::allocator<unsigned_char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined7 uStack_68;
  undefined1 local_54 [36];
  undefined4 local_30;
  
  local_88._M_dataplus._M_p = (pointer)0x6365762074736574;
  local_88._M_string_length._0_4_ = 0x726f74;
  local_88.field_2._M_local_buf[0] = 'V';
  local_88.field_2._M_local_buf[1] = 'O';
  local_88.field_2._M_local_buf[2] = 'k';
  local_88.field_2._M_local_buf[3] = 'J';
  local_88.field_2._M_local_buf[4] = 'x';
  local_88.field_2._M_local_buf[5] = 'b';
  local_88.field_2._M_local_buf[6] = 'R';
  local_88.field_2._M_local_buf[7] = 'l';
  local_88.field_2._8_7_ = 0x6b5578546d5231;
  local_88.field_2._M_local_buf[0xf] = '/';
  uStack_68 = 0x7442784a7657;
  local_54._28_8_ = 0x86d634bc01a7e7b7;
  local_30 = 0xaedf87fa;
  local_54._0_2_ = 10;
  local_54[2] = -0x80;
  local_54[3] = 'U';
  inet_pton(10,"2001:db8:1234:5678:11:2233:4455:6677",local_54 + 8);
  stun::base_message<std::allocator<unsigned_char>_>::base_message(&local_a0,0x101,local_54 + 0x1c);
  sVar5 = strlen((char *)&local_88);
  local_f0._16_8_ = (long)&local_88._M_dataplus._M_p + sVar5;
  local_f0._0_2_ = 0x8022;
  local_f0[0x18] = ' ';
  local_f0._8_8_ = &local_88;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_a0,(varsize<char> *)local_f0);
  local_c8._0_2_ = 0x20;
  sStack_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_54;
  stun::base_message<std::allocator<unsigned_char>_>::
  push_back<stun::attribute::bits::xor_socket_address>(&local_a0,(xor_socket_address *)local_c8);
  local_100.key_len_ = strlen(local_88.field_2._M_local_buf);
  local_100.key_ = (uint8_t *)&local_88.field_2;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&local_a0,&local_100);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::fingerprint>
            (&local_a0,(fingerprint *)&local_108);
  local_c8 = (undefined1  [8])&DAT_0000005c;
  local_100.key_ =
       (uint8_t *)
       stun_msg_len((stun_msg_hdr *)
                    local_a0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_f0,"sizeof(expected_result)","message.size()",
             (unsigned_long *)local_c8,(unsigned_long *)&local_100);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x13f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_c8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      local_c8 = (undefined1  [8])0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_0012ae3b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  anon_unknown.dwarf_24059::IsEqual
            ((anon_unknown_dwarf_24059 *)local_c8,&DAT_0014b3f0,
             local_a0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,0x5c);
  if (local_c8[0] == (anon_unknown_dwarf_24059)0x0) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)local_c8,
               (AssertionResult *)
               "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x141,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if ((stun_msg_hdr *)local_100.key_ != (stun_msg_hdr *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((stun_msg_hdr *)local_100.key_ != (stun_msg_hdr *)0x0)) {
        (**(code **)(*(long *)local_100.key_ + 8))();
      }
      local_100.key_ = (uint8_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8._0_4_ = 0x101;
  uVar3 = stun_msg_type((stun_msg_hdr *)
                        local_a0.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  local_100.key_ = (uint8_t *)CONCAT62(local_100.key_._2_6_,uVar3);
  testing::internal::
  CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
            ((internal *)local_f0,"stun::message::binding_response","message.type()",
             (type *)local_c8,(unsigned_short *)&local_100);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x145,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_c8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      local_c8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  msg_hdr = local_a0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar6 = stun_msg_next_attr((stun_msg_hdr *)
                              local_a0.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(stun_attr_hdr *)0x0);
  local_c8[0] = (anon_unknown_dwarf_24059)(psVar6 != (stun_attr_hdr *)0x0);
  sStack_c0.ptr_._0_1_ = '\0';
  sStack_c0.ptr_._1_1_ = '\0';
  sStack_c0.ptr_._2_1_ = '\0';
  sStack_c0.ptr_._3_1_ = '\0';
  sStack_c0.ptr_._4_1_ = '\0';
  sStack_c0.ptr_._5_1_ = '\0';
  sStack_c0.ptr_._6_1_ = '\0';
  sStack_c0.ptr_._7_1_ = '\0';
  if (psVar6 == (stun_attr_hdr *)0x0) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)local_c8,(AssertionResult *)"message.end() != i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x148,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if ((stun_msg_hdr *)local_100.key_ != (stun_msg_hdr *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((stun_msg_hdr *)local_100.key_ != (stun_msg_hdr *)0x0)) {
        (**(code **)(*(long *)local_100.key_ + 8))();
      }
      local_100.key_ = (uint8_t *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012ae3b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8._0_4_ = 0x8022;
  uVar3 = stun_attr_type(psVar6);
  local_100.key_ = (uint8_t *)CONCAT62(local_100.key_._2_6_,uVar3);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f0,"type::software","i->type()",(attribute_type *)local_c8,
             (unsigned_short *)&local_100);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x149,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_c8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      local_c8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100.key_ = msg_hdr;
  local_100.key_len_ = (size_t)psVar6;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)local_f0,(string *)&local_100);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)local_c8,"software_name","i->to<type::software>().to_string()",
             (char (*) [12])&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  plVar1 = (long *)(local_f0 + 0x10);
  if ((long *)local_f0._0_8_ != plVar1) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
  }
  if (local_c8[0] == (anon_unknown_dwarf_24059)0x0) {
    testing::Message::Message((Message *)local_f0);
    if ((undefined8 *)CONCAT44(sStack_c0.ptr_._4_4_,(uint)sStack_c0.ptr_) == (undefined8 *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = *(char **)CONCAT44(sStack_c0.ptr_._4_4_,(uint)sStack_c0.ptr_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x14b,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if ((long *)local_f0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_f0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_f0._0_8_ + 8))();
      }
      local_f0._0_8_ = (long *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012ae3b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  attr = (stun_attr_xor_sockaddr *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,psVar6);
  local_c8[0] = (anon_unknown_dwarf_24059)(attr != (stun_attr_xor_sockaddr *)0x0);
  sStack_c0.ptr_._0_1_ = '\0';
  sStack_c0.ptr_._1_1_ = '\0';
  sStack_c0.ptr_._2_1_ = '\0';
  sStack_c0.ptr_._3_1_ = '\0';
  sStack_c0.ptr_._4_1_ = '\0';
  sStack_c0.ptr_._5_1_ = '\0';
  sStack_c0.ptr_._6_1_ = '\0';
  sStack_c0.ptr_._7_1_ = '\0';
  if (attr == (stun_attr_xor_sockaddr *)0x0) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)local_c8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x14d,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((long *)local_f0._0_8_ != plVar1) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if ((stun_msg_hdr *)local_100.key_ != (stun_msg_hdr *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((stun_msg_hdr *)local_100.key_ != (stun_msg_hdr *)0x0)) {
        (**(code **)(*(long *)local_100.key_ + 8))();
      }
      local_100.key_ = (uint8_t *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0012ae3b;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c8._0_4_ = 0x20;
  uVar3 = stun_attr_type((stun_attr_hdr *)attr);
  local_100.key_ = (uint8_t *)CONCAT62(local_100.key_._2_6_,uVar3);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f0,"type::xor_mapped_address","i->type()",(attribute_type *)local_c8,
             (unsigned_short *)&local_100);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x14e,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_c8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      local_c8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uStack_b8 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  local_c8 = (undefined1  [8])0x0;
  sStack_c0.ptr_._0_4_ = 0;
  sStack_c0.ptr_._4_4_ = 0;
  iVar4 = stun_attr_xor_sockaddr_read(attr,(stun_msg_hdr *)msg_hdr,(sockaddr *)local_c8);
  local_100.key_ = (uint8_t *)CONCAT71(local_100.key_._1_7_,iVar4 == 0);
  local_100.key_len_ = 0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)&local_100,
               (AssertionResult *)
               "i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr)","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x152,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)local_f0._0_8_ != plVar1) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if (local_108.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_108.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
      local_108.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100.key_len_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100.key_ = (uint8_t *)CONCAT44(local_100.key_._4_4_,10);
  testing::internal::CmpHelperEQ<int,unsigned_short>
            ((internal *)local_f0,"10","test_addr.sin6_family",(int *)&local_100,
             (unsigned_short *)local_c8);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x153,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((long *)local_100.key_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100.key_ != (long *)0x0)) {
        (**(code **)(*(long *)local_100.key_ + 8))();
      }
      local_100.key_ = (uint8_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100.key_ = (uint8_t *)CONCAT62(local_100.key_._2_6_,0x5580);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)local_f0,"__bswap_16 (32853)","test_addr.sin6_port",
             (unsigned_short *)&local_100,(unsigned_short *)(local_c8 + 2));
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x154,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((long *)local_100.key_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100.key_ != (long *)0x0)) {
        (**(code **)(*(long *)local_100.key_ + 8))();
      }
      local_100.key_ = (uint8_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100.key_ = (uint8_t *)((ulong)local_100.key_ & 0xffffffff00000000);
  uVar7 = (ulong)(sStack_c0.ptr_._4_4_ >> 0x18) |
          (((ulong)sStack_c0.ptr_._4_4_ & 0xff0000) << 0x20) >> 0x28 |
          (((ulong)sStack_c0.ptr_._4_4_ & 0xff00) << 0x20) >> 0x18 |
          (((ulong)sStack_c0.ptr_._4_4_ & 0xff) << 0x20) >> 8 |
          ((ulong)(uint)sStack_c0.ptr_ & 0xff000000) << 8 |
          ((ulong)(uint)sStack_c0.ptr_ & 0xff0000) << 0x18 |
          ((ulong)(uint)sStack_c0.ptr_ & 0xff00) << 0x28 |
          CONCAT44(sStack_c0.ptr_._4_4_,(uint)sStack_c0.ptr_) << 0x38;
  uVar8 = (ulong)local_54._8_8_ >> 0x38 | (local_54._8_8_ & 0xff000000000000) >> 0x28 |
          (local_54._8_8_ & 0xff0000000000) >> 0x18 | (local_54._8_8_ & 0xff00000000) >> 8 |
          (local_54._8_8_ & 0xff000000) << 8 | (local_54._8_8_ & 0xff0000) << 0x18 |
          (local_54._8_8_ & 0xff00) << 0x28 | local_54._8_8_ << 0x38;
  if (uVar7 == uVar8) {
    uVar7 = (ulong)(uStack_b4 >> 0x18) | (((ulong)uStack_b4 & 0xff0000) << 0x20) >> 0x28 |
            (((ulong)uStack_b4 & 0xff00) << 0x20) >> 0x18 | (((ulong)uStack_b4 & 0xff) << 0x20) >> 8
            | ((ulong)uStack_b8 & 0xff000000) << 8 | ((ulong)uStack_b8 & 0xff0000) << 0x18 |
            ((ulong)uStack_b8 & 0xff00) << 0x28 | CONCAT44(uStack_b4,uStack_b8) << 0x38;
    uVar8 = (ulong)local_54._16_8_ >> 0x38 | (local_54._16_8_ & 0xff000000000000) >> 0x28 |
            (local_54._16_8_ & 0xff0000000000) >> 0x18 | (local_54._16_8_ & 0xff00000000) >> 8 |
            (local_54._16_8_ & 0xff000000) << 8 | (local_54._16_8_ & 0xff0000) << 0x18 |
            (local_54._16_8_ & 0xff00) << 0x28 | local_54._16_8_ << 0x38;
    uVar9 = 0;
    if (uVar7 != uVar8) goto LAB_0012a74c;
  }
  else {
LAB_0012a74c:
    uVar9 = -(uint)(uVar7 < uVar8) | 1;
  }
  local_108.data_._0_4_ = uVar9;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_f0,"0",
             "memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr, sizeof(ipv6.sin6_addr))",
             (int *)&local_100,(int *)&local_108);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x156,pcVar10);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if ((long *)local_100.key_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_100.key_ != (long *)0x0)) {
        (**(code **)(*(long *)local_100.key_ + 8))();
      }
      local_100.key_ = (uint8_t *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  msgint = (stun_attr_msgint *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)attr);
  local_100.key_ = (uint8_t *)CONCAT71(local_100.key_._1_7_,msgint != (stun_attr_msgint *)0x0);
  local_100.key_len_ = 0;
  if (msgint == (stun_attr_msgint *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f0,(internal *)&local_100,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x158,(char *)local_f0._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((long *)local_f0._0_8_ != plVar1) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if (local_108.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_108.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_108.data_ + 8))();
      }
      local_108.data_ = (AssertHelperData *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_100.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_100.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_100.key_ = (uint8_t *)CONCAT44(local_100.key_._4_4_,8);
    uVar3 = stun_attr_type((stun_attr_hdr *)msgint);
    local_108.data_._0_2_ = uVar3;
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)local_f0,"type::message_integrity","i->type()",
               (attribute_type *)&local_100,(unsigned_short *)&local_108);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_100);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x159,pcVar10);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if ((long *)local_100.key_ != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)local_100.key_ != (long *)0x0)) {
          (**(code **)(*(long *)local_100.key_ + 8))();
        }
        local_100.key_ = (uint8_t *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_f0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    local_f0._0_8_ = plVar1;
    sVar5 = strlen(local_88.field_2._M_local_buf);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,&local_88.field_2,(long)&local_88.field_2 + sVar5);
    iVar4 = stun_attr_msgint_check
                      (msgint,(stun_msg_hdr *)msg_hdr,(uint8_t *)local_f0._0_8_,local_f0._8_8_);
    local_100.key_ = (uint8_t *)CONCAT71(local_100.key_._1_7_,iVar4 != 0);
    local_100.key_len_ = 0;
    if ((long *)local_f0._0_8_ != plVar1) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    if ((char)local_100.key_ == '\0') {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f0,(internal *)&local_100,
                 (AssertionResult *)"i->to<type::message_integrity>().check_integrity(password)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x15b,(char *)local_f0._0_8_);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)local_f0._0_8_ != plVar1) {
        operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
      }
      if (local_108.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_108.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_108.data_ + 8))();
        }
        local_108.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_100.key_len_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fingerprint = (stun_attr_uint32 *)
                  stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)msgint);
    local_100.key_ =
         (uint8_t *)CONCAT71(local_100.key_._1_7_,fingerprint != (stun_attr_uint32 *)0x0);
    local_100.key_len_ = 0;
    if (fingerprint == (stun_attr_uint32 *)0x0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f0,(internal *)&local_100,(AssertionResult *)"message.end() != ++i"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x15d,(char *)local_f0._0_8_);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)local_f0._0_8_ != plVar1) {
        operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
      }
      if (local_108.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_108.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_108.data_ + 8))();
        }
        local_108.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_100.key_len_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_100.key_len_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_100.key_ = (uint8_t *)CONCAT44(local_100.key_._4_4_,0x8028);
      uVar3 = stun_attr_type((stun_attr_hdr *)fingerprint);
      local_108.data_._0_2_ = uVar3;
      testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                ((internal *)local_f0,"type::fingerprint","i->type()",(attribute_type *)&local_100,
                 (unsigned_short *)&local_108);
      if (local_f0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_100);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = ((_Alloc_hider *)local_f0._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x15e,pcVar10);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if ((long *)local_100.key_ != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_100.key_ != (long *)0x0)) {
            (**(code **)(*(long *)local_100.key_ + 8))();
          }
          local_100.key_ = (uint8_t *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_f0 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar4 = stun_attr_fingerprint_check(fingerprint,(stun_msg_hdr *)msg_hdr);
      bVar2 = iVar4 != 0;
      local_100.key_len_ = 0;
      local_100.key_._0_1_ = bVar2;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f0,(internal *)&local_100,
                   (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x160,(char *)local_f0._0_8_);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if ((long *)local_f0._0_8_ != plVar1) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
        }
        if (local_108.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_108.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_108.data_ + 8))();
          }
          local_108.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_100.key_len_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      psVar6 = stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)fingerprint);
      local_100.key_ = (uint8_t *)CONCAT71(local_100.key_._1_7_,psVar6 == (stun_attr_hdr *)0x0);
      local_100.key_len_ = 0;
      if (psVar6 != (stun_attr_hdr *)0x0) {
        testing::Message::Message((Message *)&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f0,(internal *)&local_100,
                   (AssertionResult *)"message.end() == ++i","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x162,(char *)local_f0._0_8_);
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if ((long *)local_f0._0_8_ != plVar1) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
        }
        if (local_108.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_108.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_108.data_ + 8))();
          }
          local_108.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_100.key_len_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
LAB_0012ae3b:
  if ((stun_msg_hdr *)
      local_a0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stun_msg_hdr *)0x0) {
    operator_delete(local_a0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StunMsgEncode, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  stun::message message(stun::message::binding_response, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::xor_mapped_address(ipv6)
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_response, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::xor_mapped_address, i->type());
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_TRUE(
    i->to<type::xor_mapped_address>().to_sockaddr((sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}